

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

Vec_Int_t * Llb_Nonlin4CreateVars2Q(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fBackward)

{
  uint nCapMin;
  int i;
  Vec_Int_t *p;
  ulong uVar1;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar2;
  int i_00;
  ulong uVar3;
  
  uVar3 = 0;
  p = Vec_IntAlloc(0);
  nCapMin = Cudd_ReadSize(dd);
  Vec_IntGrow(p,nCapMin);
  uVar1 = (ulong)nCapMin;
  if ((int)nCapMin < 1) {
    uVar1 = uVar3;
  }
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    p->pArray[uVar3] = 1;
  }
  p->nSize = nCapMin;
  for (i_00 = 0; i_00 < pAig->nRegs; i_00 = i_00 + 1) {
    pObj = Saig_ManLi(pAig,i_00);
    pAVar2 = Saig_ManLo(pAig,i_00);
    if (fBackward != 0) {
      pObj = pAVar2;
    }
    i = Llb_ObjBddVar(vOrder,pObj);
    Vec_IntWriteEntry(p,i,0);
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateVars2Q( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fBackward )
{
    Vec_Int_t * vVars2Q;
    Aig_Obj_t * pObjLi, * pObjLo;
    int i;
    vVars2Q = Vec_IntAlloc( 0 );
    Vec_IntFill( vVars2Q, Cudd_ReadSize(dd), 1 );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, fBackward ? pObjLo : pObjLi), 0 );
    return vVars2Q;
}